

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

TScoredWords * __thiscall
NJamSpell::TSpellCorrector::GetCandidatesRawWithScores
          (TScoredWords *__return_storage_ptr__,TSpellCorrector *this,TWords *sentence,
          size_t position)

{
  bool bVar1;
  double dVar2;
  pointer pTVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  const_reference pvVar7;
  size_type __n;
  reference pTVar8;
  double dVar9;
  iterator iVar10;
  iterator iVar11;
  TWord TVar12;
  undefined1 auStack_188 [8];
  TScoredWord scored;
  size_t i;
  TWords candSentence;
  TWord cand;
  iterator __end1;
  iterator __begin1;
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  *__range1;
  allocator<NJamSpell::TWord> local_10b;
  key_equal local_10a;
  hasher local_109;
  __normal_iterator<NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
  local_108;
  __normal_iterator<NJamSpell::TWord_*,_std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>
  local_100;
  undefined1 local_f8 [8];
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  uniqueCandidates;
  wstring local_b8 [32];
  undefined1 auStack_98 [8];
  TWord c;
  bool knownWord;
  bool firstLevel;
  undefined1 local_60 [8];
  TWords candidates;
  TWord w;
  size_t position_local;
  TWords *sentence_local;
  TSpellCorrector *this_local;
  TScoredWords *scoredCandidates;
  
  std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::vector
            (__return_storage_ptr__);
  sVar6 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size(sentence);
  if (position < sVar6) {
    pvVar7 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                       (sentence,position);
    candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pvVar7->Ptr;
    w.Ptr = (wchar_t *)pvVar7->Len;
    Edits2((TWords *)local_60,this,
           (TWord *)&candidates.
                     super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage,true);
    bVar1 = false;
    bVar4 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::empty
                      ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_60);
    if (bVar4) {
      Edits((TWords *)&c.Len,this,
            (TWord *)&candidates.
                      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator=
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_60,
                 (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&c.Len);
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&c.Len);
    }
    bVar5 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::empty
                      ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_60);
    pTVar3 = candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (!bVar5) {
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring
                (local_b8,(wchar_t *)pTVar3,(ulong)w.Ptr,
                 (allocator *)((long)&uniqueCandidates._M_h._M_single_bucket + 7));
      TVar12 = TLangModel::GetWord(&this->LangModel,(wstring *)local_b8);
      c.Ptr = (wchar_t *)TVar12.Len;
      auStack_98 = (undefined1  [8])TVar12.Ptr;
      std::__cxx11::wstring::~wstring(local_b8);
      std::allocator<wchar_t>::~allocator
                ((allocator<wchar_t> *)((long)&uniqueCandidates._M_h._M_single_bucket + 7));
      if ((auStack_98 == (undefined1  [8])0x0) || (c.Ptr == (wchar_t *)0x0)) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_60,
                   (value_type *)
                   &candidates.
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)auStack_98;
        w.Ptr = c.Ptr;
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_60,
                   (value_type *)auStack_98);
        bVar1 = true;
      }
      local_100._M_current =
           (TWord *)std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::begin
                              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                               local_60);
      local_108._M_current =
           (TWord *)std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::end
                              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                               local_60);
      std::allocator<NJamSpell::TWord>::allocator(&local_10b);
      std::
      unordered_set<NJamSpell::TWord,NJamSpell::TWordHashPtr,std::equal_to<NJamSpell::TWord>,std::allocator<NJamSpell::TWord>>
      ::
      unordered_set<__gnu_cxx::__normal_iterator<NJamSpell::TWord*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
                ((unordered_set<NJamSpell::TWord,NJamSpell::TWordHashPtr,std::equal_to<NJamSpell::TWord>,std::allocator<NJamSpell::TWord>>
                  *)local_f8,local_100,local_108,0,&local_109,&local_10a,&local_10b);
      std::allocator<NJamSpell::TWord>::~allocator(&local_10b);
      TVar12.Len = (size_t)w.Ptr;
      TVar12.Ptr = (wchar_t *)
                   candidates.
                   super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      FilterCandidatesByFrequency
                (this,(unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                       *)local_f8,TVar12);
      __n = std::
            unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
            ::size((unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                    *)local_f8);
      std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::reserve
                (__return_storage_ptr__,__n);
      __end1 = std::
               unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
               ::begin((unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                        *)local_f8);
      cand.Len = (size_t)std::
                         unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                         ::end((unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                                *)local_f8);
      while (bVar5 = std::__detail::operator!=
                               (&__end1.super__Node_iterator_base<NJamSpell::TWord,_true>,
                                (_Node_iterator_base<NJamSpell::TWord,_true> *)&cand.Len), bVar5) {
        pTVar8 = std::__detail::_Node_iterator<NJamSpell::TWord,_true,_true>::operator*(&__end1);
        candSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)pTVar8->Ptr;
        cand.Ptr = (wchar_t *)pTVar8->Len;
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
                  ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i);
        for (scored.Score = 0.0; dVar2 = scored.Score,
            dVar9 = (double)std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size
                                      (sentence), (ulong)dVar2 < (ulong)dVar9;
            scored.Score = (double)((long)scored.Score + 1)) {
          if (scored.Score == (double)position) {
            std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                      ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i,
                       (value_type *)
                       &candSentence.
                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else if ((((ulong)scored.Score < position) && (position <= (long)scored.Score + 2U)) ||
                  ((position < (ulong)scored.Score && ((ulong)scored.Score <= position + 2)))) {
            pvVar7 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                               (sentence,(size_type)scored.Score);
            std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                      ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i,pvVar7);
          }
        }
        TScoredWord::TScoredWord((TScoredWord *)auStack_188);
        auStack_188 = (undefined1  [8])
                      candSentence.
                      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
        scored.Word.Ptr = cand.Ptr;
        scored.Word.Len = (size_t)TLangModel::Score(&this->LangModel,(TWords *)&i);
        bVar5 = TWord::operator==((TWord *)auStack_188,
                                  (TWord *)&candidates.
                                            super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar5) {
          if (bVar1) {
            if (bVar4) {
              scored.Word.Len = (size_t)((double)scored.Word.Len * 50.0);
            }
            else {
              scored.Word.Len = (size_t)((double)scored.Word.Len - this->KnownWordsPenalty);
            }
          }
          else {
            scored.Word.Len = (size_t)((double)scored.Word.Len - this->UnknownWordsPenalty);
          }
        }
        std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)auStack_188);
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
                  ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&i);
        std::__detail::_Node_iterator<NJamSpell::TWord,_true,_true>::operator++(&__end1);
      }
      iVar10 = std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::begin
                         (__return_storage_ptr__);
      iVar11 = std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::end
                         (__return_storage_ptr__);
      std::
      sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,NJamSpell::TSpellCorrector::GetCandidatesRawWithScores(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>
                (iVar10._M_current,iVar11._M_current);
      std::
      unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
      ::~unordered_set((unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                        *)local_f8);
    }
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

TScoredWords TSpellCorrector::GetCandidatesRawWithScores(const TWords& sentence, size_t position) const {
    TScoredWords scoredCandidates;

    if (position >= sentence.size()) {
        return scoredCandidates;
    }

    TWord w = sentence[position];
    TWords candidates = Edits2(w);

    bool firstLevel = true;
    bool knownWord = false;
    if (candidates.empty()) {
        candidates = Edits(w);
        firstLevel = false;
    }

    if (candidates.empty()) {
        return scoredCandidates;
    }

    {
        TWord c = LangModel.GetWord(std::wstring(w.Ptr, w.Len));
        if (c.Ptr && c.Len) {
            w = c;
            candidates.push_back(c);
            knownWord = true;
        } else {
            candidates.push_back(w);
        }
    }

    std::unordered_set<TWord, TWordHashPtr> uniqueCandidates(candidates.begin(), candidates.end());

    FilterCandidatesByFrequency(uniqueCandidates, w);
    scoredCandidates.reserve(uniqueCandidates.size());

    for (TWord cand: uniqueCandidates) {
        TWords candSentence;
        for (size_t i = 0; i < sentence.size(); ++i) {
            if (i == position) {
                candSentence.push_back(cand);
            } else if ((i < position && i + 2 >= position) ||
                       (i > position && i <= position + 2))
            {
                candSentence.push_back(sentence[i]);
            }
        }

        TScoredWord scored;
        scored.Word = cand;
        scored.Score = LangModel.Score(candSentence);
        if (!(scored.Word == w)) {
            if (knownWord) {
                if (firstLevel) {
                    scored.Score -= KnownWordsPenalty;
                } else {
                    scored.Score *= 50.0;
                }
            } else {
                scored.Score -= UnknownWordsPenalty;
            }
        }
        scoredCandidates.push_back(scored);
    }

    std::sort(scoredCandidates.begin(), scoredCandidates.end(), [](TScoredWord w1, TScoredWord w2) {
        return w1.Score > w2.Score;
    });
    return scoredCandidates;
}